

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coda-rinex.c
# Opt level: O1

int get_line(FILE *f,char *line)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  int *piVar4;
  
  pcVar2 = fgets(line,1000,(FILE *)f);
  if (pcVar2 == (char *)0x0) {
    iVar1 = ferror((FILE *)f);
    if (iVar1 == 0) {
      *line = '\0';
      sVar3 = 0;
    }
    else {
      piVar4 = __errno_location();
      pcVar2 = strerror(*piVar4);
      coda_set_error(-0x16,"could not read from file (%s)",pcVar2);
      sVar3 = 0xffffffff;
    }
  }
  else {
    sVar3 = strlen(line);
    if ((0 < (long)sVar3) && (line[sVar3 - 1] == '\n')) {
      line[sVar3 - 1] = '\0';
      sVar3 = sVar3 - 1;
    }
    if ((0 < (long)sVar3) && (line[sVar3 - 1] == '\r')) {
      line[sVar3 - 1] = '\0';
      sVar3 = sVar3 - 1;
    }
  }
  return (int)sVar3;
}

Assistant:

static int get_line(FILE *f, char *line)
{
    long length;

    if (fgets(line, MAX_LINE_LENGTH, f) == NULL)
    {
        if (ferror(f))
        {
            coda_set_error(CODA_ERROR_FILE_READ, "could not read from file (%s)", strerror(errno));
            return -1;
        }
        /* end of file -> return empty line  */
        line[0] = '\0';
        return 0;
    }
    length = (long)strlen(line);

    /* remove 'linefeed' character if available */
    if (length > 0 && line[length - 1] == '\n')
    {
        line[length - 1] = '\0';
        length--;
    }

    /* remove 'carriage return' character if available */
    if (length > 0 && line[length - 1] == '\r')
    {
        line[length - 1] = '\0';
        length--;
    }

    return length;
}